

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_0.c
# Opt level: O0

void test_0(void)

{
  int iVar1;
  wchar_t wVar2;
  undefined1 local_98 [8];
  stat_conflict st;
  
  failure("File %s does not exist?!",testprog);
  iVar1 = stat(testprogfile,(stat *)local_98);
  wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_0.c"
                              ,L'\x18',0,"0",(long)iVar1,"stat(testprogfile, &st)",(void *)0x0);
  if (wVar2 == L'\0') {
    fprintf(_stderr,"\nFile %s does not exist; aborting test.\n\n",testprog);
    exit(1);
  }
  failure("%s is not executable?!",testprog);
  wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_0.c"
                           ,L' ',(uint)(((uint)st.st_nlink & 0x49) != 0),"(st.st_mode & 0111) != 0",
                           (void *)0x0);
  if (wVar2 == L'\0') {
    fprintf(_stderr,"\nFile %s not executable; aborting test.\n\n",testprog);
    exit(1);
  }
  return;
}

Assistant:

DEFINE_TEST(test_0)
{
	struct stat st;

	failure("File %s does not exist?!", testprog);
	if (!assertEqualInt(0, stat(testprogfile, &st))) {
		fprintf(stderr,
		    "\nFile %s does not exist; aborting test.\n\n",
		    testprog);
		exit(1);
	}

	failure("%s is not executable?!", testprog);
	if (!assert((st.st_mode & 0111) != 0)) {
		fprintf(stderr,
		    "\nFile %s not executable; aborting test.\n\n",
		    testprog);
		exit(1);
	}

	/* TODO: Ensure that our reference files are available. */
}